

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O3

err_t cmdSigPrint(char *sig_name,char *scope)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  cmd_sig_t *sig;
  
  bVar1 = strIsValid(sig_name);
  if (bVar1 == 0) {
    return 0x6d;
  }
  if ((scope != (char *)0x0) && (bVar1 = strIsValid(scope), bVar1 == 0)) {
    return 0x6d;
  }
  sig = (cmd_sig_t *)blobCreate(0x630);
  if (sig == (cmd_sig_t *)0x0) {
    return 0x6e;
  }
  eVar2 = cmdSigRead(sig,(size_t *)0x0,sig_name);
  if (eVar2 != 0) goto LAB_001072ef;
  if (scope == (char *)0x0) {
    printf("certc: ");
    eVar2 = cmdSigPrintCertc(sig);
    if (eVar2 != 0) {
      return eVar2;
    }
    bVar1 = memIsZero(sig->date,6);
    if (bVar1 == 0) {
      printf("\ndate:  ");
      eVar2 = cmdPrintDate(sig->date);
      if (eVar2 != 0) {
        return eVar2;
      }
    }
    printf("\nsig:   ");
    eVar2 = cmdPrintMem2(sig,sig->sig_len);
  }
  else {
    iVar3 = strCmp(scope,"certc");
    if (iVar3 == 0) {
      eVar2 = cmdSigPrintCertc(sig);
    }
    else {
      iVar3 = strCmp(scope,"date");
      if (iVar3 == 0) {
        bVar1 = memIsZero(sig->date,6);
        eVar2 = 0x134;
        if (bVar1 != 0) goto LAB_001072ef;
        eVar2 = cmdPrintDate(sig->date);
      }
      else {
        iVar3 = strCmp(scope,"sig");
        eVar2 = 0x25b;
        if (iVar3 != 0) goto LAB_001072ef;
        eVar2 = cmdPrintMem(sig,sig->sig_len);
      }
    }
  }
  if (eVar2 == 0) {
    putchar(10);
    eVar2 = 0;
  }
LAB_001072ef:
  blobClose(sig);
  return eVar2;
}

Assistant:

err_t cmdSigPrint(const char* sig_name, const char* scope)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	// входной контроль
	if (!strIsValid(sig_name) || !strIsNullOrValid(scope))
		return ERR_BAD_INPUT;
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(cmd_sig_t));
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	// читать подпись
	code = cmdSigRead(sig, 0, sig_name);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// печать всех полей
	if (scope == 0)
	{
		printf("certc: ");
		code = cmdSigPrintCertc(sig);
		ERR_CALL_CHECK(code);
		if (!memIsZero(sig->date, 6))
		{
			printf("\ndate:  ");
			code = cmdPrintDate(sig->date);
			ERR_CALL_CHECK(code);
		}
		printf("\nsig:   ");
		code = cmdPrintMem2(sig->sig, sig->sig_len);
	}
	// печать отдельных полей
	else if (strEq(scope, "certc"))
		code = cmdSigPrintCertc(sig);
	else if (strEq(scope, "date"))
		code = memIsZero(sig->date, 6) ?
			ERR_BAD_DATE : cmdPrintDate(sig->date);
	else if (strEq(scope, "sig"))
		code = cmdPrintMem(sig->sig, sig->sig_len);
	else
		code = ERR_CMD_PARAMS;
	// завершить
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	printf("\n");
	cmdBlobClose(stack);
	return code;
}